

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

void lj_lib_register(lua_State *L,char *libname,uint8_t *p,lua_CFunction *cf)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  GCproto *pt;
  GCfunc *pGVar7;
  GCstr *pGVar8;
  uint8_t uVar9;
  long lVar10;
  lua_CFunction *pp_Var11;
  byte *str;
  byte *pbVar12;
  GCtab *t;
  TValue *pTVar13;
  MSize nelems;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  GCfunc *local_110;
  GCtab *local_100;
  lua_CFunction *local_f0;
  LexState local_d8;
  
  uVar4 = (L->glref).ptr32;
  local_100 = (GCtab *)(ulong)(L->env).gcptr32;
  uVar9 = *p;
  bVar1 = p[1];
  bVar2 = p[2];
  if (libname == (char *)0x0) {
    lua_createtable(L,0,(uint)bVar2);
  }
  else {
    luaL_findtable(L,-10000,"_LOADED",0x10);
    lua_getfield(L,-1,libname);
    if (*(int *)((long)L->top + -4) != -0xc) {
      L->top = L->top + -1;
      pcVar6 = luaL_findtable(L,-0x2712,libname,(uint)bVar2);
      if (pcVar6 != (char *)0x0) {
        lj_err_callerv(L,LJ_ERR_BADMODN,libname);
      }
      pTVar13 = L->top;
      (pTVar13->field_2).field_0 = pTVar13[-1].field_2.field_0;
      (pTVar13->field_2).it = 0xfffffff4;
      L->top = L->top + 1;
      lua_setfield(L,-3,libname);
    }
    pTVar13 = L->top;
    L->top = pTVar13 + -1;
    pTVar13[-2].field_2.field_0 = pTVar13[-1].field_2.field_0;
    *(undefined4 *)((long)pTVar13 + -0xc) = 0xfffffff4;
  }
  uVar15 = L->top[-1].u32.lo;
  t = (GCtab *)(ulong)uVar15;
  lVar10 = (long)L->top - (long)L->base;
  if ((t->marked & 4) != 0) {
    uVar14 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar14 + 0x6c);
    *(uint *)(uVar14 + 0x6c) = uVar15;
  }
  uVar4 = uVar4 + (uint)bVar1 * 4 + 0x1480;
  pbVar12 = p + 3;
  t->nomm = '\0';
  local_110 = (GCfunc *)0x0;
  local_f0 = cf;
  do {
    str = pbVar12 + 1;
    bVar1 = *pbVar12;
    uVar16 = bVar1 & 0x3f;
    uVar15 = bVar1 & 0xffffffc0;
    if (uVar15 != 0xc0) {
      uVar14 = ((ulong)((long)L->top - (long)L->base) >> 3) - (lVar10 >> 3);
      nelems = (MSize)uVar14;
      pGVar7 = lj_func_newC(L,nelems,local_100);
      if (nelems != 0) {
        pTVar13 = (TValue *)((long)L->base + lVar10);
        L->top = pTVar13;
        memcpy((pGVar7->c).upvalue,pTVar13,(uVar14 & 0xffffffff) << 3);
      }
      (pGVar7->c).ffid = uVar9;
      if ((bVar1 & 0xc0) == 0) {
        uVar5 = (L->glref).ptr32 + 0x180;
      }
      else {
        uVar5 = uVar4;
        uVar4 = uVar4 + 4;
      }
      uVar9 = uVar9 + '\x01';
      pbVar12 = str + uVar16;
      (pGVar7->c).pc.ptr32 = uVar5;
      pp_Var11 = &(local_110->c).f;
      if (uVar15 != 0x80) {
        pp_Var11 = local_f0;
      }
      local_f0 = local_f0 + (uVar15 != 0x80);
      (pGVar7->c).f = *pp_Var11;
      bVar3 = true;
      local_110 = pGVar7;
      if ((bVar1 & 0x3f) != 0) {
        pGVar8 = lj_str_new(L,(char *)str,(ulong)uVar16);
        pTVar13 = lj_tab_setstr(L,t,pGVar8);
        (pTVar13->u32).lo = (uint32_t)pGVar7;
        (pTVar13->field_2).it = 0xfffffff7;
      }
      goto LAB_00116321;
    }
    switch(bVar1) {
    case 0xf9:
      bVar1 = pbVar12[1];
      pGVar8 = lj_str_new(L,(char *)(pbVar12 + 2),(ulong)bVar1);
      memset(&local_d8,0,0xa8);
      local_d8.p = (char *)(pbVar12 + (ulong)bVar1 + 2);
      local_d8.pe = (char *)0xffffffffffffffff;
      local_d8.c = -1;
      local_d8.level = 2;
      local_d8.L = L;
      local_d8.chunkname = pGVar8;
      pt = lj_bcread_proto(&local_d8);
      pt->firstline = -1;
      pGVar7 = lj_func_newL_empty(L,pt,(GCtab *)(ulong)(L->env).gcptr32);
      pTVar13 = lj_tab_setstr(L,t,pGVar8);
      (pTVar13->u32).lo = (uint32_t)pGVar7;
      (pTVar13->field_2).it = 0xfffffff7;
      str = (byte *)local_d8.p;
      break;
    case 0xfa:
      pTVar13 = L->top;
      L->top = pTVar13 + -2;
      if ((*(int *)((long)pTVar13 + -4) == -5) && (*(int *)((ulong)pTVar13[-1].u32.lo + 0xc) == 0))
      {
        local_100 = (GCtab *)(ulong)pTVar13[-2].u32.lo;
      }
      else {
        pTVar13 = lj_tab_set(L,t,pTVar13 + -1);
        *pTVar13 = *L->top;
      }
      break;
    case 0xfb:
      *L->top = *(TValue *)(pbVar12 + 1);
      L->top = L->top + 1;
      pbVar12 = pbVar12 + 9;
      goto LAB_001162ad;
    case 0xfc:
      *L->top = L->top[-(ulong)pbVar12[1]];
      L->top = L->top + 1;
      pbVar12 = pbVar12 + 2;
LAB_001162ad:
      bVar3 = true;
      goto LAB_00116321;
    case 0xfd:
      pTVar13 = L->top;
      L->top = pTVar13 + 1;
      (pTVar13->u32).lo = (uint32_t)local_110;
      (pTVar13->field_2).it = 0xfffffff7;
      break;
    case 0xfe:
      uVar9 = uVar9 + '\x01';
      break;
    case 0xff:
      bVar3 = false;
      pbVar12 = str;
      goto LAB_00116321;
    default:
      pTVar13 = L->top;
      L->top = pTVar13 + 1;
      pGVar8 = lj_str_new(L,(char *)str,(ulong)uVar16);
      (pTVar13->u32).lo = (uint32_t)pGVar8;
      (pTVar13->field_2).it = 0xfffffffb;
      str = str + uVar16;
    }
    bVar3 = true;
    pbVar12 = str;
LAB_00116321:
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void lj_lib_register(lua_State *L, const char *libname,
		     const uint8_t *p, const lua_CFunction *cf)
{
  GCtab *env = tabref(L->env);
  GCfunc *ofn = NULL;
  int ffid = *p++;
  BCIns *bcff = &L2GG(L)->bcff[*p++];
  GCtab *tab = lib_create_table(L, libname, *p++);
  ptrdiff_t tpos = L->top - L->base;

  /* Avoid barriers further down. */
  lj_gc_anybarriert(L, tab);
  tab->nomm = 0;

  for (;;) {
    uint32_t tag = *p++;
    MSize len = tag & LIBINIT_LENMASK;
    tag &= LIBINIT_TAGMASK;
    if (tag != LIBINIT_STRING) {
      const char *name;
      MSize nuv = (MSize)(L->top - L->base - tpos);
      GCfunc *fn = lj_func_newC(L, nuv, env);
      if (nuv) {
	L->top = L->base + tpos;
	memcpy(fn->c.upvalue, L->top, sizeof(TValue)*nuv);
      }
      fn->c.ffid = (uint8_t)(ffid++);
      name = (const char *)p;
      p += len;
      if (tag == LIBINIT_CF)
	setmref(fn->c.pc, &G(L)->bc_cfunc_int);
      else
	setmref(fn->c.pc, bcff++);
      if (tag == LIBINIT_ASM_)
	fn->c.f = ofn->c.f;  /* Copy handler from previous function. */
      else
	fn->c.f = *cf++;  /* Get cf or handler from C function table. */
      if (len) {
	/* NOBARRIER: See above for common barrier. */
	setfuncV(L, lj_tab_setstr(L, tab, lj_str_new(L, name, len)), fn);
      }
      ofn = fn;
    } else {
      switch (tag | len) {
      case LIBINIT_LUA:
	p = lib_read_lfunc(L, p, tab);
	break;
      case LIBINIT_SET:
	L->top -= 2;
	if (tvisstr(L->top+1) && strV(L->top+1)->len == 0)
	  env = tabV(L->top);
	else  /* NOBARRIER: See above for common barrier. */
	  copyTV(L, lj_tab_set(L, tab, L->top+1), L->top);
	break;
      case LIBINIT_NUMBER:
	memcpy(&L->top->n, p, sizeof(double));
	L->top++;
	p += sizeof(double);
	break;
      case LIBINIT_COPY:
	copyTV(L, L->top, L->top - *p++);
	L->top++;
	break;
      case LIBINIT_LASTCL:
	setfuncV(L, L->top++, ofn);
	break;
      case LIBINIT_FFID:
	ffid++;
	break;
      case LIBINIT_END:
	return;
      default:
	setstrV(L, L->top++, lj_str_new(L, (const char *)p, len));
	p += len;
	break;
      }
    }
  }
}